

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

bool __thiscall QLayoutPrivate::checkWidget(QLayoutPrivate *this,QWidget *widget)

{
  QLayout *this_00;
  QWidget *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QLayout **)&this->field_0x8;
  if (widget == (QWidget *)0x0) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    (*(code *)**(undefined8 **)this_00)(this_00);
    uVar2 = QMetaObject::className();
    QObject::objectName();
    uVar3 = QString::utf16();
    QMessageLogger::warning(local_58,"QLayout: Cannot add a null widget to %s/%ls",uVar2,uVar3);
  }
  else {
    pQVar1 = QLayout::parentWidget(this_00);
    bVar6 = true;
    if (pQVar1 != widget) goto LAB_002e3ef8;
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    (*(code *)**(undefined8 **)widget)(widget);
    uVar2 = QMetaObject::className();
    QObject::objectName();
    uVar3 = QString::utf16();
    (*(code *)**(undefined8 **)this_00)(this_00);
    uVar4 = QMetaObject::className();
    QObject::objectName();
    uVar5 = QString::utf16();
    QMessageLogger::warning
              (local_58,"QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",uVar2,
               uVar3,uVar4,uVar5);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  bVar6 = false;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
LAB_002e3ef8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar6;
  }
  __stack_chk_fail();
}

Assistant:

bool QLayoutPrivate::checkWidget(QWidget *widget) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!widget)) {
        qWarning("QLayout: Cannot add a null widget to %s/%ls", q->metaObject()->className(),
                  qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(widget == q->parentWidget())) {
        qWarning("QLayout: Cannot add parent widget %s/%ls to its child layout %s/%ls",
                  widget->metaObject()->className(), qUtf16Printable(widget->objectName()),
                  q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}